

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O0

shared_ptr<Node>
ParseComparison<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
          (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *current,
          __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> end)

{
  bool bVar1;
  logic_error *plVar2;
  pointer pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Node> sVar5;
  shared_ptr<EventComparisonNode> local_238;
  Date local_228;
  Date local_218;
  shared_ptr<DateComparisonNode> local_208;
  istringstream local_1f8 [8];
  istringstream is;
  string *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_44 [8];
  Comparison cmp;
  Token *op;
  Token *column;
  Token *local_20;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *current_local;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> end_local;
  
  local_20 = end._M_current;
  end_local._M_current = (Token *)current;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                     end._M_current,
                     (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                     &current_local);
  if (bVar1) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Expected column name: date or event");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  op = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator*
                 ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                  local_20);
  if (op->type != COLUMN) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Expected column name: date or event");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
            ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)local_20);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                     local_20,(__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                               *)&current_local);
  if (bVar1) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Expected comparison operation");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  register0x00000000 =
       __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator*
                 ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                  local_20);
  if (register0x00000000->type == COMPARE_OP) {
    __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
              ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)local_20);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                       local_20,(__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                                 *)&current_local);
    if (bVar1) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar2,"Expected right value of comparison");
      __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    bVar1 = std::operator==(&stack0xffffffffffffffc0->value,"<");
    if (bVar1) {
      local_44._0_4_ = 0;
    }
    else {
      bVar1 = std::operator==(&stack0xffffffffffffffc0->value,"<=");
      if (bVar1) {
        local_44._0_4_ = 1;
      }
      else {
        bVar1 = std::operator==(&stack0xffffffffffffffc0->value,">");
        if (bVar1) {
          local_44._0_4_ = 2;
        }
        else {
          bVar1 = std::operator==(&stack0xffffffffffffffc0->value,">=");
          if (bVar1) {
            local_44._0_4_ = 3;
          }
          else {
            bVar1 = std::operator==(&stack0xffffffffffffffc0->value,"==");
            if (bVar1) {
              local_44._0_4_ = 4;
            }
            else {
              bVar1 = std::operator==(&stack0xffffffffffffffc0->value,"!=");
              if (!bVar1) {
                plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_68,"Unknown comparison token: ",
                               &stack0xffffffffffffffc0->value);
                std::logic_error::logic_error(plVar2,(string *)&local_68);
                __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              local_44._0_4_ = 5;
            }
          }
        }
      }
    }
    pTVar3 = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
             operator->((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                        local_20);
    __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
              ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)local_20);
    bVar1 = std::operator==(&op->value,"date");
    if (bVar1) {
      std::__cxx11::istringstream::istringstream(local_1f8,pTVar3,8);
      local_228 = ParseDate((istream *)local_1f8);
      local_218 = local_228;
      std::make_shared<DateComparisonNode,Comparison&,Date>
                ((Comparison *)&local_208,(Date *)local_44);
      std::shared_ptr<Node>::shared_ptr<DateComparisonNode,void>
                ((shared_ptr<Node> *)current,&local_208);
      std::shared_ptr<DateComparisonNode>::~shared_ptr(&local_208);
      std::__cxx11::istringstream::~istringstream(local_1f8);
      _Var4._M_pi = extraout_RDX;
    }
    else {
      std::make_shared<EventComparisonNode,Comparison&,std::__cxx11::string_const&>
                ((Comparison *)&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_44);
      std::shared_ptr<Node>::shared_ptr<EventComparisonNode,void>
                ((shared_ptr<Node> *)current,&local_238);
      std::shared_ptr<EventComparisonNode>::~shared_ptr(&local_238);
      _Var4._M_pi = extraout_RDX_00;
    }
    sVar5.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
    sVar5.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)current;
    return (shared_ptr<Node>)sVar5.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
  }
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar2,"Expected comparison operation");
  __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

shared_ptr<Node> ParseComparison(It& current, It end) {
    if (current == end) {
        throw logic_error("Expected column name: date or event");
    }

    Token& column = *current;
    if (column.type != TokenType::COLUMN) {
        throw logic_error("Expected column name: date or event");
    }
    ++current;

    if (current == end) {
        throw logic_error("Expected comparison operation");
    }

    Token& op = *current;
    if (op.type != TokenType::COMPARE_OP) {
        throw logic_error("Expected comparison operation");
    }
    ++current;

    if (current == end) {
        throw logic_error("Expected right value of comparison");
    }

    Comparison cmp;
    if (op.value == "<") {
        cmp = Comparison::Less;
    } else if (op.value == "<=") {
        cmp = Comparison::LessOrEqual;
    } else if (op.value == ">") {
        cmp = Comparison::Greater;
    } else if (op.value == ">=") {
        cmp = Comparison::GreaterOrEqual;
    } else if (op.value == "==") {
        cmp = Comparison::Equal;
    } else if (op.value == "!=") {
        cmp = Comparison::NotEqual;
    } else {
        throw logic_error("Unknown comparison token: " + op.value);
    }

    const string& value = current->value;
    ++current;

    if (column.value == "date") {
        istringstream is(value);
        return make_shared<DateComparisonNode>(cmp, ParseDate(is));
    } else {
        return make_shared<EventComparisonNode>(cmp, value);
    }
}